

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildFile.cpp
# Opt level: O3

Tool * __thiscall
anon_unknown.dwarf_2b79c0::BuildFileImpl::getOrCreateTool
          (BuildFileImpl *this,StringRef name,Node *forNode)

{
  tool_set *this_00;
  Tool *pTVar1;
  int iVar2;
  long *plVar3;
  long *plVar4;
  Tool *pTVar5;
  char *pcVar6;
  StringRef message;
  pair<llvm::StringMapIterator<std::unique_ptr<llbuild::buildsystem::Tool,_std::default_delete<llbuild::buildsystem::Tool>_>_>,_bool>
  pVar7;
  Tool *local_98;
  undefined1 *local_90;
  undefined8 local_88;
  undefined1 local_80;
  undefined7 uStack_7f;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  long *local_50;
  long local_48;
  long local_40;
  long lStack_38;
  
  pcVar6 = name.Data;
  this_00 = &this->tools;
  iVar2 = llvm::StringMapImpl::FindKey(&this_00->super_StringMapImpl,name);
  if ((iVar2 == -1) || ((long)iVar2 == (ulong)(this->tools).super_StringMapImpl.NumBuckets)) {
    (*this->delegate->_vptr_BuildFileDelegate[8])(&local_98,this->delegate,pcVar6,name.Length);
    pTVar5 = local_98;
    if (local_98 == (Tool *)0x0) {
      local_90 = &local_80;
      if (pcVar6 == (char *)0x0) {
        local_88 = 0;
        local_80 = 0;
      }
      else {
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_90,pcVar6,pcVar6 + name.Length);
      }
      plVar3 = (long *)std::__cxx11::string::replace((ulong)&local_90,0,(char *)0x0,0x1fd3d0);
      plVar4 = plVar3 + 2;
      if ((long *)*plVar3 == plVar4) {
        local_60 = *plVar4;
        lStack_58 = plVar3[3];
        local_70 = &local_60;
      }
      else {
        local_60 = *plVar4;
        local_70 = (long *)*plVar3;
      }
      local_68 = plVar3[1];
      *plVar3 = (long)plVar4;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      plVar3 = (long *)std::__cxx11::string::append((char *)&local_70);
      plVar4 = plVar3 + 2;
      if ((long *)*plVar3 == plVar4) {
        local_40 = *plVar4;
        lStack_38 = plVar3[3];
        local_50 = &local_40;
      }
      else {
        local_40 = *plVar4;
        local_50 = (long *)*plVar3;
      }
      local_48 = plVar3[1];
      *plVar3 = (long)plVar4;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      message.Length = (size_t)local_50;
      message.Data = (forNode->SourceRange).End.Ptr;
      error(this,(Node *)(forNode->SourceRange).Start.Ptr,message);
      if (local_50 != &local_40) {
        operator_delete(local_50,local_40 + 1);
      }
      if (local_70 != &local_60) {
        operator_delete(local_70,local_60 + 1);
      }
      if (local_90 != &local_80) {
        operator_delete(local_90,CONCAT71(uStack_7f,local_80) + 1);
      }
    }
    else {
      pVar7 = llvm::
              StringMap<std::unique_ptr<llbuild::buildsystem::Tool,_std::default_delete<llbuild::buildsystem::Tool>_>,_llvm::MallocAllocator>
              ::try_emplace<>(this_00,name);
      pTVar1 = local_98;
      local_98 = (Tool *)0x0;
      plVar3 = *(long **)(*(long *)pVar7.first.
                                   super_StringMapIterBase<llvm::StringMapIterator<std::unique_ptr<llbuild::buildsystem::Tool,_std::default_delete<llbuild::buildsystem::Tool>_>_>,_llvm::StringMapEntry<std::unique_ptr<llbuild::buildsystem::Tool,_std::default_delete<llbuild::buildsystem::Tool>_>_>_>
                                   .Ptr.
                                   super_StringMapIterBase<llvm::StringMapIterator<std::unique_ptr<llbuild::buildsystem::Tool,_std::default_delete<llbuild::buildsystem::Tool>_>_>,_llvm::StringMapEntry<std::unique_ptr<llbuild::buildsystem::Tool,_std::default_delete<llbuild::buildsystem::Tool>_>_>_>
                         + 8);
      *(Tool **)(*(long *)pVar7.first.
                          super_StringMapIterBase<llvm::StringMapIterator<std::unique_ptr<llbuild::buildsystem::Tool,_std::default_delete<llbuild::buildsystem::Tool>_>_>,_llvm::StringMapEntry<std::unique_ptr<llbuild::buildsystem::Tool,_std::default_delete<llbuild::buildsystem::Tool>_>_>_>
                          .Ptr.
                          super_StringMapIterBase<llvm::StringMapIterator<std::unique_ptr<llbuild::buildsystem::Tool,_std::default_delete<llbuild::buildsystem::Tool>_>_>,_llvm::StringMapEntry<std::unique_ptr<llbuild::buildsystem::Tool,_std::default_delete<llbuild::buildsystem::Tool>_>_>_>
                + 8) = pTVar1;
      if (plVar3 == (long *)0x0) {
        return pTVar5;
      }
      (**(code **)(*plVar3 + 8))();
    }
    if (local_98 != (Tool *)0x0) {
      (*local_98->_vptr_Tool[1])();
    }
  }
  else {
    pTVar5 = (Tool *)(this_00->super_StringMapImpl).TheTable[iVar2][1].StrLen;
  }
  return pTVar5;
}

Assistant:

Tool* getOrCreateTool(StringRef name, llvm::yaml::Node* forNode) {
    // First, check the map.
    auto it = tools.find(name);
    if (it != tools.end())
      return it->second.get();
    
    // Otherwise, ask the delegate to create the tool.
    auto tool = delegate.lookupTool(name);
    if (!tool) {
      error(forNode, "invalid tool (" + name.str() +") type in 'tools' map");
      return nullptr;
    }
    auto result = tool.get();
    tools[name] = std::move(tool);

    return result;
  }